

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O3

void __thiscall spvtools::opt::UpgradeMemoryModel::UpgradeInstructions(UpgradeMemoryModel *this)

{
  Module *pMVar1;
  pointer puVar2;
  pointer puVar3;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar3 = *(pointer *)
            &(pMVar1->functions_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
             ._M_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  if (puVar3 != puVar2) {
    do {
      local_50._8_8_ = 0;
      local_38 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/upgrade_memory_model.cpp:84:22)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/upgrade_memory_model.cpp:84:22)>
                 ::_M_manager;
      local_50._M_unused._M_object = this;
      Function::ForEachInst
                ((Function *)
                 (puVar3->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ,(function<void_(spvtools::opt::Instruction_*)> *)&local_50,false,false);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar2);
  }
  UpgradeMemoryAndImages(this);
  UpgradeAtomics(this);
  return;
}

Assistant:

void UpgradeMemoryModel::UpgradeInstructions() {
  // Coherent and Volatile decorations are deprecated. Remove them and replace
  // with flags on the memory/image operations. The decorations can occur on
  // OpVariable, OpFunctionParameter (of pointer type) and OpStructType (member
  // decoration). Trace from the decoration target(s) to the final memory/image
  // instructions. Additionally, Workgroup storage class variables and function
  // parameters are implicitly coherent in GLSL450.

  // Upgrade modf and frexp first since they generate new stores.
  // In SPIR-V 1.4 or later, normalize OpCopyMemory* access operands.
  for (auto& func : *get_module()) {
    func.ForEachInst([this](Instruction* inst) {
      if (inst->opcode() == spv::Op::OpExtInst) {
        auto ext_inst = inst->GetSingleWordInOperand(1u);
        if (ext_inst == GLSLstd450Modf || ext_inst == GLSLstd450Frexp) {
          auto import =
              get_def_use_mgr()->GetDef(inst->GetSingleWordInOperand(0u));
          if (import->GetInOperand(0u).AsString() == "GLSL.std.450") {
            UpgradeExtInst(inst);
          }
        }
      } else if (get_module()->version() >= SPV_SPIRV_VERSION_WORD(1, 4)) {
        if (inst->opcode() == spv::Op::OpCopyMemory ||
            inst->opcode() == spv::Op::OpCopyMemorySized) {
          uint32_t start_operand =
              inst->opcode() == spv::Op::OpCopyMemory ? 2u : 3u;
          if (inst->NumInOperands() > start_operand) {
            auto num_access_words = MemoryAccessNumWords(
                inst->GetSingleWordInOperand(start_operand));
            if ((num_access_words + start_operand) == inst->NumInOperands()) {
              // There is a single memory access operand. Duplicate it to have a
              // separate operand for both source and target.
              for (uint32_t i = 0; i < num_access_words; ++i) {
                auto operand = inst->GetInOperand(start_operand + i);
                inst->AddOperand(std::move(operand));
              }
            }
          } else {
            // Add two memory access operands.
            inst->AddOperand({SPV_OPERAND_TYPE_MEMORY_ACCESS,
                              {uint32_t(spv::MemoryAccessMask::MaskNone)}});
            inst->AddOperand({SPV_OPERAND_TYPE_MEMORY_ACCESS,
                              {uint32_t(spv::MemoryAccessMask::MaskNone)}});
          }
        }
      }
    });
  }

  UpgradeMemoryAndImages();
  UpgradeAtomics();
}